

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool __thiscall BasicBlock::Contains(BasicBlock *this,Instr *instr)

{
  Instr **ppIVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  Instr *pIVar7;
  Func **ppFVar8;
  Instr *pIVar9;
  Instr *pIVar10;
  
  pBVar2 = this->next;
  ppFVar8 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar8 = &this->func;
  }
  lVar6 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar6 = 0xd0;
  }
  lVar6 = *(long *)((long)&(*ppFVar8)->m_alloc + lVar6);
  if (lVar6 == 0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    pIVar10 = *(Instr **)(lVar6 + 0x10);
  }
  pIVar9 = this->firstInstr;
  if (pIVar9 == pIVar10) {
    bVar4 = false;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar7 = (Instr *)0x0;
    do {
      if ((pIVar7 != (Instr *)0x0) && (pIVar7->m_next != pIVar9)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xe7c,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == blockInstr)"
                           ,"Modifying instr list but not using EDITING iterator!");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      bVar4 = pIVar9 == instr;
    } while ((!bVar4) &&
            (ppIVar1 = &pIVar9->m_next, pIVar7 = pIVar9, pIVar9 = *ppIVar1, *ppIVar1 != pIVar10));
  }
  return bVar4;
}

Assistant:

bool
BasicBlock::Contains(IR::Instr * instr)
{
    FOREACH_INSTR_IN_BLOCK(blockInstr, this)
    {
        if (instr == blockInstr)
        {
            return true;
        }
    }
    NEXT_INSTR_IN_BLOCK;
    return false;
}